

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall cmComputeLinkInformation::AddExternalObjectTargets(cmComputeLinkInformation *this)

{
  cmGeneratorTarget *this_00;
  pointer ppcVar1;
  pointer ppcVar2;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar3;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> externalObjects;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_188;
  vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *local_170;
  pointer local_168;
  cmComputeLinkInformation *local_160;
  _Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  cmLinkItem local_c8;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_60;
  
  local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmGeneratorTarget::GetExternalObjects
            (this->Target,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&local_158,
             &this->Config);
  local_f8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f8._M_impl.super__Rb_tree_header._M_header;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_170 = (vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *)
              &this->ExternalObjectTargets;
  local_168 = local_158._M_impl.super__Vector_impl_data._M_finish;
  ppcVar1 = local_158._M_impl.super__Vector_impl_data._M_finish;
  ppcVar2 = local_158._M_impl.super__Vector_impl_data._M_start;
  local_160 = this;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if (ppcVar2 == ppcVar1) break;
    cmSourceFile::GetObjectLibrary_abi_cxx11_(&local_118,*ppcVar2);
    if (local_118._M_string_length != 0) {
      pVar3 = std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_f8,&local_118);
      if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        this_00 = local_160->Target;
        std::__cxx11::string::string((string *)&local_138,(string *)&local_118);
        local_188.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_188.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_188);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                  (&local_60,&local_138,(cmListFileBacktrace *)&local_188);
        cmGeneratorTarget::ResolveLinkItem
                  (&local_c8,this_00,&local_60,&cmLinkItem::DEFAULT_abi_cxx11_);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                  (&local_60);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_188.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__cxx11::string::~string((string *)&local_138);
        if (local_c8.Target != (cmGeneratorTarget *)0x0) {
          std::vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>::
          emplace_back<cmGeneratorTarget_const*const&>(local_170,&local_c8.Target);
        }
        cmLinkItem::~cmLinkItem(&local_c8);
        ppcVar1 = local_168;
      }
    }
    std::__cxx11::string::~string((string *)&local_118);
    ppcVar2 = ppcVar2 + 1;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_f8);
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&local_158);
  return;
}

Assistant:

void cmComputeLinkInformation::AddExternalObjectTargets()
{
  std::vector<cmSourceFile const*> externalObjects;
  this->Target->GetExternalObjects(externalObjects, this->Config);
  std::set<std::string> emitted;
  for (auto const* externalObject : externalObjects) {
    std::string const& objLib = externalObject->GetObjectLibrary();
    if (objLib.empty()) {
      continue;
    }
    if (emitted.insert(objLib).second) {
      cmLinkItem const& objItem =
        this->Target->ResolveLinkItem(BT<std::string>(objLib));
      if (objItem.Target) {
        this->ExternalObjectTargets.emplace_back(objItem.Target);
      }
    }
  }
}